

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O0

bool __thiscall
GrcManager::AddAllGlyphsToTheAnyClass
          (GrcManager *this,GrcFont *pfont,
          map<unsigned_short,_unsigned_short,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
          *hmActualForPseudo)

{
  GdlGlyphClassDefn *this_00;
  GdlGlyphClassDefn *pGVar1;
  GdlGlyphClassMember *pglfd;
  undefined8 in_RDX;
  undefined8 in_RSI;
  GrcSymbolTableEntry *in_RDI;
  GrpLineAndFile lnf;
  GdlGlyphDefn *pglf;
  GdlGlyphClassDefn *pglfcAny;
  Symbol psym;
  undefined8 in_stack_ffffffffffffff40;
  int nLast;
  GrpLineAndFile *lnf_00;
  string *in_stack_ffffffffffffff78;
  GrcSymbolTable *in_stack_ffffffffffffff80;
  allocator local_41;
  string local_40 [32];
  GdlGlyphClassDefn *local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  nLast = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"ANY",&local_41);
  this_00 = (GdlGlyphClassDefn *)
            GrcSymbolTable::FindSymbol(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_20 = this_00;
  pGVar1 = GrcSymbolTableEntry::GlyphClassDefnData(in_RDI);
  pglfd = (GdlGlyphClassMember *)operator_new(0xb0);
  GdlGlyphDefn::GdlGlyphDefn
            ((GdlGlyphDefn *)this_00,(GlyphType)((ulong)pglfd >> 0x20),(int)pglfd,nLast);
  lnf_00 = (GrpLineAndFile *)&stack0xffffffffffffff70;
  GrpLineAndFile::GrpLineAndFile((GrpLineAndFile *)0x1324a0);
  GdlGlyphClassDefn::AddMember(this_00,pglfd,lnf_00);
  (*(pGVar1->super_GdlGlyphClassMember).super_GdlDefn._vptr_GdlDefn[0x1b])
            (pGVar1,local_10,(ulong)*(ushort *)&in_RDI[2].m_lnf.field_0x18,local_18);
  GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x1324ef);
  return true;
}

Assistant:

bool GrcManager::AddAllGlyphsToTheAnyClass(GrcFont * pfont,
	std::map<utf16, utf16> & hmActualForPseudo)
{
	Symbol psym = m_psymtbl->FindSymbol("ANY");
	GdlGlyphClassDefn * pglfcAny = psym->GlyphClassDefnData();
	Assert(pglfcAny);

	GdlGlyphDefn * pglf = new GdlGlyphDefn(kglftGlyphID, 0, int(m_cwGlyphIDs - 1));
	GrpLineAndFile lnf;	// bogus
	pglfcAny->AddMember(pglf, lnf);

	pglfcAny->AssignGlyphIDs(pfont, gr::gid16(m_cwGlyphIDs), hmActualForPseudo);

	return true;
}